

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O2

CURLcode rtsp_do(connectdata *conn,_Bool *done)

{
  long *plVar1;
  Curl_RtspReq CVar2;
  SessionHandle *data;
  void *pvVar3;
  long lVar4;
  char *pcVar5;
  CURLcode CVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  Curl_send_buffer *in;
  size_t size;
  curl_off_t *writecountp;
  char *pcVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  Curl_HttpReq CVar15;
  char *local_70;
  char *local_68;
  char *local_58;
  char *local_50;
  
  data = conn->data;
  CVar2 = (data->set).rtspreq;
  pvVar3 = (data->req).protop;
  *done = true;
  lVar4 = (data->state).rtsp_next_client_CSeq;
  *(undefined8 *)((long)pvVar3 + 0x90) = 0;
  *(long *)((long)pvVar3 + 0x88) = lVar4;
  (data->set).opt_no_body = true;
  switch(CVar2) {
  case RTSPREQ_NONE:
    pcVar12 = "Got invalid RTSP request: RTSPREQ_NONE";
    goto LAB_00506b0a;
  case RTSPREQ_OPTIONS:
    pcVar12 = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    (data->set).opt_no_body = false;
    pcVar12 = "DESCRIBE";
    break;
  case RTSPREQ_ANNOUNCE:
    pcVar12 = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    pcVar12 = "SETUP";
    break;
  case RTSPREQ_PLAY:
    pcVar12 = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    pcVar12 = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    pcVar12 = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    (data->set).opt_no_body = false;
    pcVar12 = "GET_PARAMETER";
    break;
  case RTSPREQ_SET_PARAMETER:
    pcVar12 = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    pcVar12 = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    (data->set).opt_no_body = false;
    Curl_setup_transfer(conn,0,-1,true,(curl_off_t *)((long)pvVar3 + 0x28),-1,(curl_off_t *)0x0);
    return CURLE_OK;
  case RTSPREQ_LAST:
    pcVar12 = "Got invalid RTSP request: RTSPREQ_LAST";
    goto LAB_00506b0a;
  default:
    pcVar12 = "";
  }
  pcVar5 = (data->set).str[0x22];
  if (RTSPREQ_TEARDOWN < CVar2 && pcVar5 == (char *)0x0) {
    Curl_failf(data,"Refusing to issue an RTSP request [%s] without a session ID.");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  pcVar8 = (data->set).str[0x23];
  pcVar11 = "*";
  if (pcVar8 != (char *)0x0) {
    pcVar11 = pcVar8;
  }
  local_50 = Curl_checkheaders(conn,"Transport:");
  if (local_50 == (char *)0x0 && CVar2 == RTSPREQ_SETUP) {
    pcVar8 = (data->set).str[0x24];
    if (pcVar8 == (char *)0x0) {
      pcVar12 = "Refusing to issue an RTSP SETUP without a Transport: header.";
      goto LAB_00506b0a;
    }
    pcVar9 = (conn->allocptr).rtsp_transport;
    if (pcVar9 != (char *)0x0) {
      (*Curl_cfree)(pcVar9);
      (conn->allocptr).rtsp_transport = (char *)0x0;
      pcVar8 = (data->set).str[0x24];
    }
    local_58 = (char *)0x0;
    local_50 = curl_maprintf("Transport: %s\r\n",pcVar8);
    (conn->allocptr).rtsp_transport = local_50;
    if (local_50 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
LAB_00506967:
    local_70 = (char *)0x0;
  }
  else {
    if (CVar2 != RTSPREQ_DESCRIBE) {
      local_58 = (char *)0x0;
      goto LAB_00506967;
    }
    pcVar8 = Curl_checkheaders(conn,"Accept:");
    local_70 = (char *)0x0;
    local_58 = "Accept: application/sdp\r\n";
    if (pcVar8 != (char *)0x0) {
      local_58 = (char *)0x0;
    }
    pcVar8 = Curl_checkheaders(conn,"Accept-Encoding:");
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (data->set).str[6];
      if (pcVar8 == (char *)0x0) goto LAB_00506967;
      pcVar9 = (conn->allocptr).accept_encoding;
      if (pcVar9 != (char *)0x0) {
        (*Curl_cfree)(pcVar9);
        (conn->allocptr).accept_encoding = (char *)0x0;
        pcVar8 = (data->set).str[6];
      }
      local_70 = curl_maprintf("Accept-Encoding: %s\r\n",pcVar8);
      (conn->allocptr).accept_encoding = local_70;
      if (local_70 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
  }
  pcVar8 = Curl_checkheaders(conn,"User-Agent:");
  if ((pcVar8 == (char *)0x0) || (pcVar8 = (conn->allocptr).uagent, pcVar8 == (char *)0x0)) {
    pcVar8 = Curl_checkheaders(conn,"User-Agent:");
    if ((pcVar8 != (char *)0x0) || ((data->set).str[0x19] == (char *)0x0)) goto LAB_005069bb;
    local_68 = (conn->allocptr).uagent;
  }
  else {
    (*Curl_cfree)(pcVar8);
    (conn->allocptr).uagent = (char *)0x0;
LAB_005069bb:
    local_68 = (char *)0x0;
  }
  pcVar8 = (conn->allocptr).ref;
  if (pcVar8 != (char *)0x0) {
    (*Curl_cfree)(pcVar8);
    (conn->allocptr).ref = (char *)0x0;
  }
  if (((data->change).referer == (char *)0x0) ||
     (pcVar8 = Curl_checkheaders(conn,"Referer:"), pcVar8 != (char *)0x0)) {
    pcVar8 = (char *)0x0;
  }
  else {
    pcVar8 = curl_maprintf("Referer: %s\r\n",(data->change).referer);
  }
  (conn->allocptr).ref = pcVar8;
  pcVar9 = (char *)0x0;
  if (((CVar2 & (RTSPREQ_LAST|RTSPREQ_ANNOUNCE)) != RTSPREQ_NONE) &&
     ((data->state).use_range != false)) {
    pcVar9 = Curl_checkheaders(conn,"Range:");
    if ((pcVar9 == (char *)0x0) && (pcVar9 = (data->state).range, pcVar9 != (char *)0x0)) {
      pcVar10 = (conn->allocptr).rangeline;
      if (pcVar10 != (char *)0x0) {
        (*Curl_cfree)(pcVar10);
        (conn->allocptr).rangeline = (char *)0x0;
        pcVar9 = (data->state).range;
      }
      pcVar9 = curl_maprintf("Range: %s\r\n",pcVar9);
      (conn->allocptr).rangeline = pcVar9;
    }
    else {
      pcVar9 = (char *)0x0;
    }
  }
  pcVar10 = Curl_checkheaders(conn,"CSeq:");
  if (pcVar10 != (char *)0x0) {
    Curl_failf(data,"CSeq cannot be set as a custom header.");
    return CURLE_RTSP_CSEQ_ERROR;
  }
  pcVar10 = Curl_checkheaders(conn,"Session:");
  if (pcVar10 != (char *)0x0) {
    pcVar12 = "Session ID cannot be set as a custom header.";
LAB_00506b0a:
    Curl_failf(data,pcVar12);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  in = Curl_add_buffer_init();
  if (in == (Curl_send_buffer *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  CVar6 = Curl_add_bufferf(in,"%s %s RTSP/1.0\r\nCSeq: %ld\r\n",pcVar12,pcVar11,
                           *(undefined8 *)((long)pvVar3 + 0x88));
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if ((pcVar5 != (char *)0x0) &&
     (CVar6 = Curl_add_bufferf(in,"Session: %s\r\n",pcVar5), CVar6 != CURLE_OK)) {
    return CVar6;
  }
  if (local_50 == (char *)0x0) {
    local_50 = "";
  }
  if (local_58 == (char *)0x0) {
    local_58 = "";
  }
  if (local_70 == (char *)0x0) {
    local_70 = "";
  }
  if (pcVar9 == (char *)0x0) {
    pcVar9 = "";
  }
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "";
  }
  if (local_68 == (char *)0x0) {
    local_68 = "";
  }
  CVar6 = Curl_add_bufferf(in,"%s%s%s%s%s%s",local_50,local_58,local_70,pcVar9,pcVar8,local_68);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if (((CVar2 == RTSPREQ_SETUP) || (CVar2 == RTSPREQ_DESCRIBE)) &&
     (CVar6 = Curl_add_timecondition(data,in), CVar6 != CURLE_OK)) {
    return CVar6;
  }
  CVar6 = Curl_add_custom_headers(conn,false,in);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  size = 0;
  if (RTSPREQ_SET_PARAMETER < CVar2) {
    sVar13 = 0;
    goto LAB_00506d4d;
  }
  sVar13 = 0;
  if ((0x308U >> (CVar2 & 0x1f) & 1) == 0) goto LAB_00506d4d;
  if ((data->set).upload == true) {
    sVar13 = (data->state).infilesize;
    CVar15 = HTTPREQ_PUT;
    size = 0;
  }
  else {
    size = (data->set).postfieldsize;
    CVar15 = HTTPREQ_POST;
    if (size == 0xffffffffffffffff) {
      pcVar12 = (char *)(data->set).postfields;
      if (pcVar12 == (char *)0x0) {
        size = 0;
      }
      else {
        size = strlen(pcVar12);
      }
    }
    sVar13 = 0;
  }
  (data->set).httpreq = CVar15;
  if ((long)size < 1 && (long)sVar13 < 1) {
    if (CVar2 == RTSPREQ_GET_PARAMETER) {
      (data->set).httpreq = HTTPREQ_HEAD;
      (data->set).opt_no_body = true;
    }
    goto LAB_00506d4d;
  }
  pcVar12 = Curl_checkheaders(conn,"Content-Length:");
  if (pcVar12 == (char *)0x0) {
    sVar14 = size;
    if ((data->set).upload != false) {
      sVar14 = sVar13;
    }
    CVar6 = Curl_add_bufferf(in,"Content-Length: %ld\r\n",sVar14);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
  }
  if ((CVar2 & RTSPREQ_RECORD) == RTSPREQ_GET_PARAMETER) {
    pcVar12 = Curl_checkheaders(conn,"Content-Type:");
    if (pcVar12 == (char *)0x0) {
      pcVar12 = "Content-Type: text/parameters\r\n";
LAB_00506d2d:
      CVar6 = Curl_add_bufferf(in,pcVar12);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
    }
  }
  else if ((CVar2 == RTSPREQ_ANNOUNCE) &&
          (pcVar12 = Curl_checkheaders(conn,"Content-Type:"), pcVar12 == (char *)0x0)) {
    pcVar12 = "Content-Type: application/sdp\r\n";
    goto LAB_00506d2d;
  }
  (data->state).expect100header = false;
LAB_00506d4d:
  (data->req).forbidchunk = true;
  CVar6 = Curl_add_buffer(in,"\r\n",2);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
  if ((0 < (long)size) &&
     (CVar6 = Curl_add_buffer(in,(data->set).postfields,size), CVar6 != CURLE_OK)) {
    return CVar6;
  }
  CVar6 = Curl_add_buffer_send(in,conn,&(data->info).request_size,0,0);
  if (CVar6 != CURLE_OK) {
    Curl_failf(data,"Failed sending RTSP request");
    return CVar6;
  }
  writecountp = (curl_off_t *)((long)pvVar3 + 0x30);
  if (sVar13 == 0) {
    writecountp = (curl_off_t *)0x0;
  }
  Curl_setup_transfer(conn,0,-1,true,(curl_off_t *)((long)pvVar3 + 0x28),-(uint)(sVar13 == 0),
                      writecountp);
  plVar1 = &(data->state).rtsp_next_client_CSeq;
  *plVar1 = *plVar1 + 1;
  if (*(long *)((long)pvVar3 + 0x30) != 0) {
    Curl_pgrsSetUploadCounter(data,*(long *)((long)pvVar3 + 0x30));
    iVar7 = Curl_pgrsUpdate(conn);
    if (iVar7 == 0) {
      return CURLE_OK;
    }
    return CURLE_ABORTED_BY_CALLBACK;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode rtsp_do(struct connectdata *conn, bool *done)
{
  struct SessionHandle *data = conn->data;
  CURLcode result=CURLE_OK;
  Curl_RtspReq rtspreq = data->set.rtspreq;
  struct RTSP *rtsp = data->req.protop;
  struct HTTP *http;
  Curl_send_buffer *req_buffer;
  curl_off_t postsize = 0; /* for ANNOUNCE and SET_PARAMETER */
  curl_off_t putsize = 0; /* for ANNOUNCE and SET_PARAMETER */

  const char *p_request = NULL;
  const char *p_session_id = NULL;
  const char *p_accept = NULL;
  const char *p_accept_encoding = NULL;
  const char *p_range = NULL;
  const char *p_referrer = NULL;
  const char *p_stream_uri = NULL;
  const char *p_transport = NULL;
  const char *p_uagent = NULL;

  *done = TRUE;

  http = &(rtsp->http_wrapper);
  /* Assert that no one has changed the RTSP struct in an evil way */
  DEBUGASSERT((void *)http == (void *)rtsp);

  rtsp->CSeq_sent = data->state.rtsp_next_client_CSeq;
  rtsp->CSeq_recv = 0;

  /* Setup the 'p_request' pointer to the proper p_request string
   * Since all RTSP requests are included here, there is no need to
   * support custom requests like HTTP.
   **/
  DEBUGASSERT((rtspreq > RTSPREQ_NONE && rtspreq < RTSPREQ_LAST));
  data->set.opt_no_body = TRUE; /* most requests don't contain a body */
  switch(rtspreq) {
  case RTSPREQ_NONE:
    failf(data, "Got invalid RTSP request: RTSPREQ_NONE");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  case RTSPREQ_OPTIONS:
    p_request = "OPTIONS";
    break;
  case RTSPREQ_DESCRIBE:
    p_request = "DESCRIBE";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_ANNOUNCE:
    p_request = "ANNOUNCE";
    break;
  case RTSPREQ_SETUP:
    p_request = "SETUP";
    break;
  case RTSPREQ_PLAY:
    p_request = "PLAY";
    break;
  case RTSPREQ_PAUSE:
    p_request = "PAUSE";
    break;
  case RTSPREQ_TEARDOWN:
    p_request = "TEARDOWN";
    break;
  case RTSPREQ_GET_PARAMETER:
    /* GET_PARAMETER's no_body status is determined later */
    p_request = "GET_PARAMETER";
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_SET_PARAMETER:
    p_request = "SET_PARAMETER";
    break;
  case RTSPREQ_RECORD:
    p_request = "RECORD";
    break;
  case RTSPREQ_RECEIVE:
    p_request = "";
    /* Treat interleaved RTP as body*/
    data->set.opt_no_body = FALSE;
    break;
  case RTSPREQ_LAST:
    failf(data, "Got invalid RTSP request: RTSPREQ_LAST");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  if(rtspreq == RTSPREQ_RECEIVE) {
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE,
                        &http->readbytecount, -1, NULL);

    return result;
  }

  p_session_id = data->set.str[STRING_RTSP_SESSION_ID];
  if(!p_session_id &&
     (rtspreq & ~(RTSPREQ_OPTIONS | RTSPREQ_DESCRIBE | RTSPREQ_SETUP))) {
    failf(data, "Refusing to issue an RTSP request [%s] without a session ID.",
          p_request ? p_request : "");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* TODO: auth? */
  /* TODO: proxy? */

  /* Stream URI. Default to server '*' if not specified */
  if(data->set.str[STRING_RTSP_STREAM_URI]) {
    p_stream_uri = data->set.str[STRING_RTSP_STREAM_URI];
  }
  else {
    p_stream_uri = "*";
  }

  /* Transport Header for SETUP requests */
  p_transport = Curl_checkheaders(conn, "Transport:");
  if(rtspreq == RTSPREQ_SETUP && !p_transport) {
    /* New Transport: setting? */
    if(data->set.str[STRING_RTSP_TRANSPORT]) {
      Curl_safefree(conn->allocptr.rtsp_transport);

      conn->allocptr.rtsp_transport =
        aprintf("Transport: %s\r\n",
                data->set.str[STRING_RTSP_TRANSPORT]);
      if(!conn->allocptr.rtsp_transport)
        return CURLE_OUT_OF_MEMORY;
    }
    else {
      failf(data,
            "Refusing to issue an RTSP SETUP without a Transport: header.");
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }

    p_transport = conn->allocptr.rtsp_transport;
  }

  /* Accept Headers for DESCRIBE requests */
  if(rtspreq == RTSPREQ_DESCRIBE) {
    /* Accept Header */
    p_accept = Curl_checkheaders(conn, "Accept:")?
      NULL:"Accept: application/sdp\r\n";

    /* Accept-Encoding header */
    if(!Curl_checkheaders(conn, "Accept-Encoding:") &&
       data->set.str[STRING_ENCODING]) {
      Curl_safefree(conn->allocptr.accept_encoding);
      conn->allocptr.accept_encoding =
        aprintf("Accept-Encoding: %s\r\n", data->set.str[STRING_ENCODING]);

      if(!conn->allocptr.accept_encoding)
        return CURLE_OUT_OF_MEMORY;

      p_accept_encoding = conn->allocptr.accept_encoding;
    }
  }

  /* The User-Agent string might have been allocated in url.c already, because
     it might have been used in the proxy connect, but if we have got a header
     with the user-agent string specified, we erase the previously made string
     here. */
  if(Curl_checkheaders(conn, "User-Agent:") && conn->allocptr.uagent) {
    Curl_safefree(conn->allocptr.uagent);
    conn->allocptr.uagent = NULL;
  }
  else if(!Curl_checkheaders(conn, "User-Agent:") &&
          data->set.str[STRING_USERAGENT]) {
    p_uagent = conn->allocptr.uagent;
  }

  /* Referrer */
  Curl_safefree(conn->allocptr.ref);
  if(data->change.referer && !Curl_checkheaders(conn, "Referer:"))
    conn->allocptr.ref = aprintf("Referer: %s\r\n", data->change.referer);
  else
    conn->allocptr.ref = NULL;

  p_referrer = conn->allocptr.ref;

  /*
   * Range Header
   * Only applies to PLAY, PAUSE, RECORD
   *
   * Go ahead and use the Range stuff supplied for HTTP
   */
  if(data->state.use_range &&
     (rtspreq  & (RTSPREQ_PLAY | RTSPREQ_PAUSE | RTSPREQ_RECORD))) {

    /* Check to see if there is a range set in the custom headers */
    if(!Curl_checkheaders(conn, "Range:") && data->state.range) {
      Curl_safefree(conn->allocptr.rangeline);
      conn->allocptr.rangeline = aprintf("Range: %s\r\n", data->state.range);
      p_range = conn->allocptr.rangeline;
    }
  }

  /*
   * Sanity check the custom headers
   */
  if(Curl_checkheaders(conn, "CSeq:")) {
    failf(data, "CSeq cannot be set as a custom header.");
    return CURLE_RTSP_CSEQ_ERROR;
  }
  if(Curl_checkheaders(conn, "Session:")) {
    failf(data, "Session ID cannot be set as a custom header.");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  /* Initialize a dynamic send buffer */
  req_buffer = Curl_add_buffer_init();

  if(!req_buffer)
    return CURLE_OUT_OF_MEMORY;

  result =
    Curl_add_bufferf(req_buffer,
                     "%s %s RTSP/1.0\r\n" /* Request Stream-URI RTSP/1.0 */
                     "CSeq: %ld\r\n", /* CSeq */
                     (p_request ? p_request : ""), p_stream_uri,
                     rtsp->CSeq_sent);
  if(result)
    return result;

  /*
   * Rather than do a normal alloc line, keep the session_id unformatted
   * to make comparison easier
   */
  if(p_session_id) {
    result = Curl_add_bufferf(req_buffer, "Session: %s\r\n", p_session_id);
    if(result)
      return result;
  }

  /*
   * Shared HTTP-like options
   */
  result = Curl_add_bufferf(req_buffer,
                            "%s" /* transport */
                            "%s" /* accept */
                            "%s" /* accept-encoding */
                            "%s" /* range */
                            "%s" /* referrer */
                            "%s" /* user-agent */
                            ,
                            p_transport ? p_transport : "",
                            p_accept ? p_accept : "",
                            p_accept_encoding ? p_accept_encoding : "",
                            p_range ? p_range : "",
                            p_referrer ? p_referrer : "",
                            p_uagent ? p_uagent : "");
  if(result)
    return result;

  if((rtspreq == RTSPREQ_SETUP) || (rtspreq == RTSPREQ_DESCRIBE)) {
    result = Curl_add_timecondition(data, req_buffer);
    if(result)
      return result;
  }

  result = Curl_add_custom_headers(conn, FALSE, req_buffer);
  if(result)
    return result;

  if(rtspreq == RTSPREQ_ANNOUNCE ||
     rtspreq == RTSPREQ_SET_PARAMETER ||
     rtspreq == RTSPREQ_GET_PARAMETER) {

    if(data->set.upload) {
      putsize = data->state.infilesize;
      data->set.httpreq = HTTPREQ_PUT;

    }
    else {
      postsize = (data->set.postfieldsize != -1)?
        data->set.postfieldsize:
        (data->set.postfields? (curl_off_t)strlen(data->set.postfields):0);
      data->set.httpreq = HTTPREQ_POST;
    }

    if(putsize > 0 || postsize > 0) {
      /* As stated in the http comments, it is probably not wise to
       * actually set a custom Content-Length in the headers */
      if(!Curl_checkheaders(conn, "Content-Length:")) {
        result = Curl_add_bufferf(req_buffer,
            "Content-Length: %" CURL_FORMAT_CURL_OFF_T"\r\n",
            (data->set.upload ? putsize : postsize));
        if(result)
          return result;
      }

      if(rtspreq == RTSPREQ_SET_PARAMETER ||
         rtspreq == RTSPREQ_GET_PARAMETER) {
        if(!Curl_checkheaders(conn, "Content-Type:")) {
          result = Curl_add_bufferf(req_buffer,
              "Content-Type: text/parameters\r\n");
          if(result)
            return result;
        }
      }

      if(rtspreq == RTSPREQ_ANNOUNCE) {
        if(!Curl_checkheaders(conn, "Content-Type:")) {
          result = Curl_add_bufferf(req_buffer,
              "Content-Type: application/sdp\r\n");
          if(result)
            return result;
        }
      }

      data->state.expect100header = FALSE; /* RTSP posts are simple/small */
    }
    else if(rtspreq == RTSPREQ_GET_PARAMETER) {
      /* Check for an empty GET_PARAMETER (heartbeat) request */
      data->set.httpreq = HTTPREQ_HEAD;
      data->set.opt_no_body = TRUE;
    }
  }

  /* RTSP never allows chunked transfer */
  data->req.forbidchunk = TRUE;
  /* Finish the request buffer */
  result = Curl_add_buffer(req_buffer, "\r\n", 2);
  if(result)
    return result;

  if(postsize > 0) {
    result = Curl_add_buffer(req_buffer, data->set.postfields,
                             (size_t)postsize);
    if(result)
      return result;
  }

  /* issue the request */
  result = Curl_add_buffer_send(req_buffer, conn,
                                &data->info.request_size, 0, FIRSTSOCKET);
  if(result) {
    failf(data, "Failed sending RTSP request");
    return result;
  }

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, TRUE, &http->readbytecount,
                      putsize?FIRSTSOCKET:-1,
                      putsize?&http->writebytecount:NULL);

  /* Increment the CSeq on success */
  data->state.rtsp_next_client_CSeq++;

  if(http->writebytecount) {
    /* if a request-body has been sent off, we make sure this progress is
       noted properly */
    Curl_pgrsSetUploadCounter(data, http->writebytecount);
    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
  }

  return result;
}